

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::DataSegmentModuleField::~DataSegmentModuleField(DataSegmentModuleField *this)

{
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__DataSegmentModuleField_001848e8;
  DataSegment::~DataSegment(&this->data_segment);
  return;
}

Assistant:

explicit DataSegmentModuleField(const Location& loc = Location(),
                                  std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::DataSegment>(loc),
        data_segment(name) {}